

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O0

void __thiscall picobench::runner::run_benchmarks(runner *this,int random_seed)

{
  benchmark_proc p_Var1;
  benchmark_impl *pbVar2;
  bool bVar3;
  vector<picobench::rsuite,_std::allocator<picobench::rsuite>_> *this_00;
  reference prVar4;
  reference this_01;
  reference this_02;
  ostream *poVar5;
  char *pcVar6;
  reference this_03;
  pointer pbVar7;
  reference ppbVar8;
  reference piVar9;
  result_type_conflict rVar10;
  size_type sVar11;
  reference psVar12;
  vector<int,_std::allocator<int>_> *local_15c8;
  const_iterator local_1568;
  __normal_iterator<picobench::state_*,_std::vector<picobench::state,_std::allocator<picobench::state>_>_>
  local_1560;
  reference local_1558;
  benchmark_impl **b_2;
  __normal_iterator<picobench::benchmark_impl_**,_std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>_>
  local_1548;
  __normal_iterator<picobench::benchmark_impl_**,_std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>_>
  i_1;
  pthread_t cur;
  size_t __cpu;
  cpu_set_t cpuset;
  const_iterator local_1498;
  __normal_iterator<picobench::state_*,_std::vector<picobench::state,_std::allocator<picobench::state>_>_>
  local_1490;
  __normal_iterator<picobench::state_*,_std::vector<picobench::state,_std::allocator<picobench::state>_>_>
  local_1488;
  __normal_iterator<picobench::state_*,_std::vector<picobench::state,_std::allocator<picobench::state>_>_>
  pos;
  unsigned_long index;
  int i;
  int iters;
  const_iterator __end3;
  const_iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  vector<int,_std::allocator<int>_> *state_iterations;
  benchmark_impl *b_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_> *__range2_1;
  unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *b;
  __normal_iterator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
  local_1420;
  __normal_iterator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
  ib;
  unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *rb;
  __normal_iterator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
  local_1400;
  iterator irb;
  bool found_baseline;
  rsuite *suite;
  iterator __end2;
  iterator __begin2;
  vector<picobench::rsuite,_std::allocator<picobench::rsuite>_> *__range2;
  vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_> benchmarks;
  minstd_rand rnd;
  random_device local_13a0;
  result_type local_14;
  runner *prStack_10;
  int random_seed_local;
  runner *this_local;
  
  local_14 = random_seed;
  prStack_10 = this;
  if (random_seed == -1) {
    std::random_device::random_device(&local_13a0);
    local_14 = std::random_device::operator()(&local_13a0);
    std::random_device::~random_device(&local_13a0);
  }
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
             &benchmarks.
              super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)local_14);
  std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>::vector
            ((vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_> *)
             &__range2);
  this_00 = &(this->super_registry)._suites;
  __end2 = std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::begin(this_00);
  suite = (rsuite *)std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::end(this_00)
  ;
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<picobench::rsuite_*,_std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>_>
                                     *)&suite), bVar3) {
    prVar4 = __gnu_cxx::
             __normal_iterator<picobench::rsuite_*,_std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>_>
             ::operator*(&__end2);
    irb._M_current._7_1_ = 0;
    local_1400._M_current =
         (unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *)
         std::
         vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
         ::begin(&prVar4->benchmarks);
    while( true ) {
      rb = (unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *
           )std::
            vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
            ::end(&prVar4->benchmarks);
      bVar3 = __gnu_cxx::operator!=
                        (&local_1400,
                         (__normal_iterator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
                          *)&rb);
      if (!bVar3) break;
      this_01 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
                ::operator*(&local_1400);
      pbVar7 = std::
               unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ::operator->(this_01);
      std::vector<picobench::state,_std::allocator<picobench::state>_>::clear(&pbVar7->_states);
      ib._M_current =
           (unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *
           )std::
            unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>::
            get(this_01);
      std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>::
      push_back((vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_> *
                )&__range2,(value_type *)&ib);
      pbVar7 = std::
               unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ::operator->(this_01);
      if (((pbVar7->super_benchmark)._baseline & 1U) != 0) {
        irb._M_current._7_1_ = 1;
      }
      local_1420 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
                   ::operator+(&local_1400,1);
      while( true ) {
        b = (unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
             *)std::
               vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
               ::end(&prVar4->benchmarks);
        bVar3 = __gnu_cxx::operator!=
                          (&local_1420,
                           (__normal_iterator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
                            *)&b);
        if (!bVar3) break;
        this_02 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
                  ::operator*(&local_1420);
        pbVar7 = std::
                 unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                 ::operator->(this_01);
        p_Var1 = (pbVar7->super_benchmark)._proc;
        pbVar7 = std::
                 unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                 ::operator->(this_02);
        if (p_Var1 == (pbVar7->super_benchmark)._proc) {
          poVar5 = std::operator<<(this->_stdwarn,"Warning: ");
          pbVar7 = std::
                   unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                   ::operator->(this_01);
          pcVar6 = benchmark::name(&pbVar7->super_benchmark);
          poVar5 = std::operator<<(poVar5,pcVar6);
          poVar5 = std::operator<<(poVar5," and ");
          pbVar7 = std::
                   unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                   ::operator->(this_02);
          pcVar6 = benchmark::name(&pbVar7->super_benchmark);
          poVar5 = std::operator<<(poVar5,pcVar6);
          std::operator<<(poVar5," are benchmarks of the same function.\n");
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
        ::operator++(&local_1420);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_*,_std::vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>_>
      ::operator++(&local_1400);
    }
    if (((irb._M_current._7_1_ & 1) == 0) &&
       (bVar3 = std::
                vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                ::empty(&prVar4->benchmarks), !bVar3)) {
      this_03 = std::
                vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                ::front(&prVar4->benchmarks);
      pbVar7 = std::
               unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ::operator->(this_03);
      (pbVar7->super_benchmark)._baseline = true;
    }
    __gnu_cxx::
    __normal_iterator<picobench::rsuite_*,_std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
             ::begin((vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                      *)&__range2);
  b_1 = (benchmark_impl *)
        std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>::end
                  ((vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                    *)&__range2);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<picobench::benchmark_impl_**,_std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>_>
                             *)&b_1), bVar3) {
    ppbVar8 = __gnu_cxx::
              __normal_iterator<picobench::benchmark_impl_**,_std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>_>
              ::operator*(&__end2_1);
    pbVar2 = *ppbVar8;
    bVar3 = std::vector<int,_std::allocator<int>_>::empty
                      (&(pbVar2->super_benchmark)._state_iterations);
    if (bVar3) {
      local_15c8 = &this->_default_state_iterations;
    }
    else {
      local_15c8 = &(pbVar2->super_benchmark)._state_iterations;
    }
    if ((pbVar2->super_benchmark)._samples == 0) {
      (pbVar2->super_benchmark)._samples = this->_default_samples;
    }
    sVar11 = std::vector<int,_std::allocator<int>_>::size(local_15c8);
    std::vector<picobench::state,_std::allocator<picobench::state>_>::reserve
              (&pbVar2->_states,sVar11 * (long)(pbVar2->super_benchmark)._samples);
    __end3 = std::vector<int,_std::allocator<int>_>::begin(local_15c8);
    _i = std::vector<int,_std::allocator<int>_>::end(local_15c8);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&i), bVar3) {
      piVar9 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end3);
      index._4_4_ = *piVar9;
      for (index._0_4_ = 0; (int)index < (pbVar2->super_benchmark)._samples;
          index._0_4_ = (int)index + 1) {
        rVar10 = std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
                 operator()((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *
                            )&benchmarks.
                              super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar11 = std::vector<picobench::state,_std::allocator<picobench::state>_>::size
                           (&pbVar2->_states);
        pos._M_current = (state *)(rVar10 % (sVar11 + 1));
        local_1490._M_current =
             (state *)std::vector<picobench::state,_std::allocator<picobench::state>_>::begin
                                (&pbVar2->_states);
        local_1488 = __gnu_cxx::
                     __normal_iterator<picobench::state_*,_std::vector<picobench::state,_std::allocator<picobench::state>_>_>
                     ::operator+(&local_1490,pos._M_current);
        __gnu_cxx::
        __normal_iterator<picobench::state_const*,std::vector<picobench::state,std::allocator<picobench::state>>>
        ::__normal_iterator<picobench::state*>
                  ((__normal_iterator<picobench::state_const*,std::vector<picobench::state,std::allocator<picobench::state>>>
                    *)&local_1498,&local_1488);
        std::vector<picobench::state,std::allocator<picobench::state>>::emplace<int&,unsigned_long&>
                  ((vector<picobench::state,std::allocator<picobench::state>> *)&pbVar2->_states,
                   local_1498,(int *)((long)&index + 4),&(pbVar2->super_benchmark)._user_data);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end3);
    }
    cpuset.__bits[0xf] =
         (__cpu_mask)
         std::vector<picobench::state,_std::allocator<picobench::state>_>::begin(&pbVar2->_states);
    (pbVar2->_istate)._M_current = (state *)cpuset.__bits[0xf];
    __gnu_cxx::
    __normal_iterator<picobench::benchmark_impl_**,_std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>_>
    ::operator++(&__end2_1);
  }
  memset(&__cpu,0,0x80);
  __cpu = __cpu | 1;
  i_1._M_current = (benchmark_impl **)pthread_self();
  pthread_setaffinity_np((pthread_t)i_1._M_current,0x80,(cpu_set_t *)&__cpu);
  while (bVar3 = std::
                 vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>::
                 empty((vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                        *)&__range2), ((bVar3 ^ 0xffU) & 1) != 0) {
    b_2 = (benchmark_impl **)
          std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>::
          begin((vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_> *
                )&__range2);
    rVar10 = std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::operator()
                       ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                        &benchmarks.
                         super__Vector_base<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar11 = std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
             ::size((vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                     *)&__range2);
    local_1548 = __gnu_cxx::
                 __normal_iterator<picobench::benchmark_impl_**,_std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>_>
                 ::operator+((__normal_iterator<picobench::benchmark_impl_**,_std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>_>
                              *)&b_2,rVar10 % sVar11);
    local_1558 = __gnu_cxx::
                 __normal_iterator<picobench::benchmark_impl_**,_std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>_>
                 ::operator*(&local_1548);
    p_Var1 = ((*local_1558)->super_benchmark)._proc;
    psVar12 = __gnu_cxx::
              __normal_iterator<picobench::state_*,_std::vector<picobench::state,_std::allocator<picobench::state>_>_>
              ::operator*(&(*local_1558)->_istate);
    (*p_Var1)(psVar12);
    __gnu_cxx::
    __normal_iterator<picobench::state_*,_std::vector<picobench::state,_std::allocator<picobench::state>_>_>
    ::operator++(&(*local_1558)->_istate);
    pbVar2 = *local_1558;
    local_1560._M_current =
         (state *)std::vector<picobench::state,_std::allocator<picobench::state>_>::end
                            (&(*local_1558)->_states);
    bVar3 = __gnu_cxx::operator==(&pbVar2->_istate,&local_1560);
    if (bVar3) {
      __gnu_cxx::
      __normal_iterator<picobench::benchmark_impl*const*,std::vector<picobench::benchmark_impl*,std::allocator<picobench::benchmark_impl*>>>
      ::__normal_iterator<picobench::benchmark_impl**>
                ((__normal_iterator<picobench::benchmark_impl*const*,std::vector<picobench::benchmark_impl*,std::allocator<picobench::benchmark_impl*>>>
                  *)&local_1568,&local_1548);
      std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>::erase
                ((vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>
                  *)&__range2,local_1568);
    }
  }
  std::vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_>::~vector
            ((vector<picobench::benchmark_impl_*,_std::allocator<picobench::benchmark_impl_*>_> *)
             &__range2);
  return;
}

Assistant:

void run_benchmarks(int random_seed = -1)
    {
        I_PICOBENCH_ASSERT(_error == no_error && _should_run);

        if (random_seed == -1)
        {
            random_seed = int(std::random_device()());
        }

        std::minstd_rand rnd(random_seed);

        // vector of all benchmarks
        std::vector<benchmark_impl*> benchmarks;
        for (auto& suite : _suites)
        {
            // also identify a baseline in this loop
            // if there is no explicit one, set the first one as a baseline
            bool found_baseline = false;
            for (auto irb = suite.benchmarks.begin(); irb != suite.benchmarks.end(); ++irb)
            {
                auto& rb = *irb;
                rb->_states.clear(); // clear states so we can safely call run_benchmarks multiple times
                benchmarks.push_back(rb.get());
                if (rb->_baseline)
                {
                    found_baseline = true;
                }

#if !defined(PICOBENCH_STD_FUNCTION_BENCHMARKS)
                // check for same func
                for (auto ib = irb+1; ib != suite.benchmarks.end(); ++ib)
                {
                    auto& b = *ib;
                    if (rb->_proc == b->_proc)
                    {
                        *_stdwarn << "Warning: " << rb->name() << " and " << b->name()
                                 << " are benchmarks of the same function.\n";
                    }
                }
#endif
            }

            if (!found_baseline && !suite.benchmarks.empty())
            {
                suite.benchmarks.front()->_baseline = true;
            }
        }

        // initialize benchmarks
        for (auto b : benchmarks)
        {
            const std::vector<int>& state_iterations =
                b->_state_iterations.empty() ?
                _default_state_iterations :
                b->_state_iterations;

            if (b->_samples == 0)
                b->_samples = _default_samples;

            b->_states.reserve(state_iterations.size() * size_t(b->_samples));

            // fill states while random shuffling them
            for (auto iters : state_iterations)
            {
                for (int i = 0; i < b->_samples; ++i)
                {
                    auto index = rnd() % (b->_states.size() + 1);
                    auto pos = b->_states.begin() + long(index);
                    b->_states.emplace(pos, iters, b->_user_data);
                }
            }

            b->_istate = b->_states.begin();
        }

#if !defined(PICOBENCH_DONT_BIND_TO_ONE_CORE)
        // set thread affinity to first cpu
        // so the high resolution clock doesn't miss cycles
        {
#if defined(_WIN32)
        SetThreadAffinityMask(GetCurrentThread(), 1);
#elif defined(__APPLE__)
        thread_affinity_policy_data_t policy = {0};
        thread_policy_set(
            pthread_mach_thread_np(pthread_self()),
            THREAD_AFFINITY_POLICY,
            (thread_policy_t)&policy, 1);
#else
        cpu_set_t cpuset;
        CPU_ZERO(&cpuset);
        CPU_SET(0, &cpuset);

        pthread_t cur = pthread_self();
        pthread_setaffinity_np(cur, sizeof(cpu_set_t), &cpuset);
#endif
        }
#endif

        // we run a random benchmark from it incrementing _istate for each
        // when _istate reaches _states.end(), we erase the benchmark
        // when the vector becomes empty, we're done
        while (!benchmarks.empty())
        {
            auto i = benchmarks.begin() + long(rnd() % benchmarks.size());
            auto& b = *i;

            b->_proc(*b->_istate);

            ++b->_istate;

            if (b->_istate == b->_states.end())
            {
                benchmarks.erase(i);
            }
        }
    }